

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

int separatorMoveHelper(QList<QLayoutStruct> *list,int index,int delta,int sep)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  qsizetype qVar4;
  const_reference pQVar5;
  QList<QLayoutStruct> *this;
  reference pQVar6;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  QList<QLayoutStruct> *in_RDI;
  QLayoutStruct *ls_3;
  int i_7;
  bool first;
  int i_6;
  int i_5;
  int d_1;
  QLayoutStruct *ls_2;
  int i_4;
  int growlimit_1;
  int i_3;
  int i_2;
  int d;
  QLayoutStruct *ls_1;
  int i_1;
  int growlimit;
  QLayoutStruct *ls;
  int i;
  int pos;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  QLayoutStruct *in_stack_ffffffffffffff40;
  int local_74;
  int local_6c;
  int local_68;
  int local_64;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_38;
  int local_34;
  int local_24;
  int local_20;
  int local_18;
  int local_4;
  
  local_20 = -1;
  for (local_24 = 0; qVar4 = QList<QLayoutStruct>::size(in_RDI), local_24 < qVar4;
      local_24 = local_24 + 1) {
    pQVar5 = QList<QLayoutStruct>::at
                       ((QList<QLayoutStruct> *)in_stack_ffffffffffffff40,
                        CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if ((pQVar5->empty & 1U) == 0) {
      local_20 = pQVar5->pos;
      break;
    }
  }
  if (local_20 == -1) {
    local_4 = 0;
  }
  else {
    local_18 = in_EDX;
    if (in_EDX < 1) {
      if (in_EDX < 0) {
        local_50 = 0;
        for (local_54 = in_ESI + 1; qVar4 = QList<QLayoutStruct>::size(in_RDI), local_54 < qVar4;
            local_54 = local_54 + 1) {
          pQVar5 = QList<QLayoutStruct>::at
                             ((QList<QLayoutStruct> *)in_stack_ffffffffffffff40,
                              CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          if ((pQVar5->empty & 1U) == 0) {
            if (pQVar5->maximumSize == 0x7ffff) {
              local_50 = 0x7ffff;
              break;
            }
            local_50 = (pQVar5->maximumSize - pQVar5->size) + local_50;
          }
        }
        if (local_50 < -in_EDX) {
          local_18 = -local_50;
        }
        local_68 = in_ESI;
        for (local_64 = 0; iVar2 = local_64,
            SBORROW4(local_64,-local_18) != local_64 + local_18 < 0 && -1 < local_68;
            local_64 = iVar2 + local_64) {
          QList<QLayoutStruct>::operator[]
                    ((QList<QLayoutStruct> *)in_stack_ffffffffffffff40,
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          iVar2 = shrink(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
          local_68 = local_68 + -1;
        }
        local_18 = -local_64;
        local_64 = 0;
        local_6c = in_ESI + 1;
        while( true ) {
          bVar1 = false;
          if (local_64 < iVar2) {
            qVar4 = QList<QLayoutStruct>::size(in_RDI);
            bVar1 = local_6c < qVar4;
          }
          if (!bVar1) break;
          QList<QLayoutStruct>::operator[]
                    ((QList<QLayoutStruct> *)in_stack_ffffffffffffff40,
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          iVar3 = grow(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
          local_64 = iVar3 + local_64;
          local_6c = local_6c + 1;
        }
      }
    }
    else {
      local_34 = 0;
      for (local_38 = 0; local_38 <= in_ESI; local_38 = local_38 + 1) {
        pQVar5 = QList<QLayoutStruct>::at
                           ((QList<QLayoutStruct> *)in_stack_ffffffffffffff40,
                            CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        if ((pQVar5->empty & 1U) == 0) {
          if (pQVar5->maximumSize == 0x7ffff) {
            local_34 = 0x7ffff;
            break;
          }
          local_34 = (pQVar5->maximumSize - pQVar5->size) + local_34;
        }
      }
      if (local_34 < in_EDX) {
        local_18 = local_34;
      }
      local_44 = 0;
      local_48 = in_ESI + 1;
      while( true ) {
        iVar2 = local_44;
        bVar1 = false;
        if (local_44 < local_18) {
          qVar4 = QList<QLayoutStruct>::size(in_RDI);
          bVar1 = local_48 < qVar4;
        }
        if (!bVar1) break;
        QList<QLayoutStruct>::operator[]
                  ((QList<QLayoutStruct> *)in_stack_ffffffffffffff40,
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        iVar2 = shrink(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        local_44 = iVar2 + local_44;
        local_48 = local_48 + 1;
      }
      local_18 = local_44;
      local_4c = in_ESI;
      for (local_44 = 0; local_44 < iVar2 && -1 < local_4c; local_44 = iVar3 + local_44) {
        QList<QLayoutStruct>::operator[]
                  ((QList<QLayoutStruct> *)in_stack_ffffffffffffff40,
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        iVar3 = grow(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        local_4c = local_4c + -1;
      }
    }
    bVar1 = true;
    local_74 = 0;
    while( true ) {
      this = (QList<QLayoutStruct> *)(long)local_74;
      qVar4 = QList<QLayoutStruct>::size(in_RDI);
      if (qVar4 <= (long)this) break;
      pQVar6 = QList<QLayoutStruct>::operator[]
                         (this,CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if ((pQVar6->empty & 1U) == 0) {
        if (!bVar1) {
          local_20 = in_ECX + local_20;
        }
        pQVar6->pos = local_20;
        local_20 = pQVar6->size + local_20;
        bVar1 = false;
      }
      else {
        in_stack_ffffffffffffff38 = in_ECX;
        if (bVar1) {
          in_stack_ffffffffffffff38 = 0;
        }
        pQVar6->pos = local_20 + in_stack_ffffffffffffff38;
        in_stack_ffffffffffffff3c = local_20;
      }
      local_74 = local_74 + 1;
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

static int separatorMoveHelper(QList<QLayoutStruct> &list, int index, int delta, int sep)
{
    // adjust sizes
    int pos = -1;
    for (int i = 0; i < list.size(); ++i) {
        const QLayoutStruct &ls = list.at(i);
        if (!ls.empty) {
            pos = ls.pos;
            break;
        }
    }
    if (pos == -1)
        return 0;

    if (delta > 0) {
        int growlimit = 0;
        for (int i = 0; i<=index; ++i) {
            const QLayoutStruct &ls = list.at(i);
            if (ls.empty)
                continue;
            if (ls.maximumSize == QLAYOUTSIZE_MAX) {
                growlimit = QLAYOUTSIZE_MAX;
                break;
            }
            growlimit += ls.maximumSize - ls.size;
        }
        if (delta > growlimit)
            delta = growlimit;

        int d = 0;
        for (int i = index + 1; d < delta && i < list.size(); ++i)
            d += shrink(list[i], delta - d);
        delta = d;
        d = 0;
        for (int i = index; d < delta && i >= 0; --i)
            d += grow(list[i], delta - d);
    } else if (delta < 0) {
        int growlimit = 0;
        for (int i = index + 1; i < list.size(); ++i) {
            const QLayoutStruct &ls = list.at(i);
            if (ls.empty)
                continue;
            if (ls.maximumSize == QLAYOUTSIZE_MAX) {
                growlimit = QLAYOUTSIZE_MAX;
                break;
            }
            growlimit += ls.maximumSize - ls.size;
        }
        if (-delta > growlimit)
            delta = -growlimit;

        int d = 0;
        for (int i = index; d < -delta && i >= 0; --i)
            d += shrink(list[i], -delta - d);
        delta = -d;
        d = 0;
        for (int i = index + 1; d < -delta && i < list.size(); ++i)
            d += grow(list[i], -delta - d);
    }

    // adjust positions
    bool first = true;
    for (int i = 0; i < list.size(); ++i) {
        QLayoutStruct &ls = list[i];
        if (ls.empty) {
            ls.pos = pos + (first ? 0 : sep);
            continue;
        }
        if (!first)
            pos += sep;
        ls.pos = pos;
        pos += ls.size;
        first = false;
    }

    return delta;
}